

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::refine(btSoftBody *this,ImplicitFn *ifn,btScalar accurary,bool cut)

{
  int *piVar1;
  undefined8 *puVar2;
  uint uVar3;
  btScalar bVar4;
  btScalar bVar5;
  Face *pFVar6;
  btScalar bVar7;
  ulong uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  Node *pNVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  btVector3 *pbVar22;
  int iVar23;
  Node **ppNVar24;
  Link *pLVar25;
  Link *pLVar26;
  btScalar *pbVar27;
  Link *pLVar28;
  Link *pLVar29;
  int j;
  uint uVar30;
  int iVar31;
  ulong uVar32;
  bool bVar33;
  byte bVar34;
  float fVar35;
  float fVar36;
  float t;
  btScalar bVar37;
  float fVar39;
  undefined1 auVar38 [16];
  float fVar40;
  btVector3 bVar41;
  float local_1b0;
  float local_1ac;
  btScalar local_198;
  btScalar bStack_194;
  btAlignedObjectArray<int> ranks;
  btSymMatrix<int> edges;
  btAlignedObjectArray<int> cnodes;
  btVector3 x;
  btAlignedObjectArray<int> todelete;
  
  bVar34 = 0;
  pNVar14 = (this->m_nodes).m_data;
  uVar3 = (this->m_nodes).m_size;
  x.m_floats[0] = -NAN;
  btSymMatrix<int>::btSymMatrix(&edges,uVar3,(int *)&x);
  iVar31 = 0;
  while( true ) {
    iVar21 = (this->m_links).m_size;
    pLVar29 = (this->m_links).m_data;
    if (iVar21 <= iVar31) break;
    if ((pLVar29[iVar31].field_0x24 & 1) != 0) {
      fVar35 = (float)(**(code **)(*(long *)ifn + 0x10))(ifn,&pLVar29[iVar31].m_n[0]->m_x);
      fVar36 = (float)(**(code **)(*(long *)ifn + 0x10))(ifn,&pLVar29[iVar31].m_n[1]->m_x);
      if (fVar35 * fVar36 <= 0.0) {
        pLVar29 = (this->m_links).m_data;
        pLVar28 = pLVar29 + iVar31;
        pLVar29 = pLVar29 + (long)(this->m_links).m_size + -1;
        lVar15 = 9;
        pLVar25 = pLVar28;
        pbVar27 = x.m_floats;
        for (; lVar15 != 0; lVar15 = lVar15 + -1) {
          *(void **)pbVar27 = (pLVar25->super_Feature).super_Element.m_tag;
          pLVar25 = (Link *)((long)pLVar25 + (ulong)bVar34 * -0x10 + 8);
          pbVar27 = pbVar27 + (ulong)bVar34 * 0xfffffffffffffffc + 2;
        }
        lVar15 = 0x44;
        pLVar25 = pLVar29;
        for (lVar16 = lVar15; pbVar27 = x.m_floats, lVar16 != 0; lVar16 = lVar16 + -1) {
          *(undefined1 *)&(pLVar28->super_Feature).super_Element.m_tag =
               *(undefined1 *)&(pLVar25->super_Feature).super_Element.m_tag;
          pLVar25 = (Link *)((long)pLVar25 + (ulong)bVar34 * -2 + 1);
          pLVar28 = (Link *)((long)pLVar28 + (ulong)bVar34 * -2 + 1);
        }
        for (; lVar15 != 0; lVar15 = lVar15 + -1) {
          *(undefined1 *)&(pLVar29->super_Feature).super_Element.m_tag = *(undefined1 *)pbVar27;
          pbVar27 = (btScalar *)((long)pbVar27 + (ulong)bVar34 * -2 + 1);
          pLVar29 = (Link *)((long)pLVar29 + (ulong)bVar34 * -2 + 1);
        }
        piVar1 = &(this->m_links).m_size;
        *piVar1 = *piVar1 + -1;
        iVar31 = iVar31 + -1;
      }
    }
    iVar31 = iVar31 + 1;
  }
  ppNVar24 = pLVar29->m_n + 1;
  for (lVar15 = 0; lVar15 < iVar21; lVar15 = lVar15 + 1) {
    iVar13 = (int)(((long)ppNVar24[-1] - (long)pNVar14) / 0x78);
    iVar31 = (int)(((long)*ppNVar24 - (long)pNVar14) / 0x78);
    iVar21 = iVar31;
    if (iVar13 < iVar31) {
      iVar21 = iVar13;
    }
    if (iVar31 < iVar13) {
      iVar31 = iVar13;
    }
    edges.store.m_data[(iVar31 * (iVar31 + 1)) / 2 + iVar21] = -1;
    iVar21 = (this->m_links).m_size;
    ppNVar24 = ppNVar24 + 9;
  }
  ppNVar24 = ((this->m_faces).m_data)->m_n + 2;
  for (lVar15 = 0; lVar15 < (this->m_faces).m_size; lVar15 = lVar15 + 1) {
    iVar13 = (int)(((long)ppNVar24[-2] - (long)pNVar14) / 0x78);
    iVar21 = (int)(((long)ppNVar24[-1] - (long)pNVar14) / 0x78);
    iVar31 = iVar21;
    if (iVar13 < iVar21) {
      iVar31 = iVar13;
    }
    iVar23 = iVar21;
    if (iVar21 < iVar13) {
      iVar23 = iVar13;
    }
    edges.store.m_data[((iVar23 + 1) * iVar23) / 2 + iVar31] = -1;
    iVar23 = (int)(((long)*ppNVar24 - (long)pNVar14) / 0x78);
    iVar31 = iVar23;
    if (iVar21 < iVar23) {
      iVar31 = iVar21;
    }
    if (iVar21 <= iVar23) {
      iVar21 = iVar23;
    }
    edges.store.m_data[((iVar21 + 1) * iVar21) / 2 + iVar31] = -1;
    iVar31 = iVar13;
    if (iVar23 < iVar13) {
      iVar31 = iVar23;
    }
    if (iVar13 < iVar23) {
      iVar13 = iVar23;
    }
    edges.store.m_data[((iVar13 + 1) * iVar13) / 2 + iVar31] = -1;
    ppNVar24 = ppNVar24 + 9;
  }
  uVar17 = 0;
  if (0 < (int)uVar3) {
    uVar17 = (ulong)uVar3;
  }
  uVar20 = 1;
  uVar32 = 0;
  while (uVar32 != uVar17) {
    for (uVar19 = uVar20; iVar31 = (int)uVar19, iVar31 < (int)uVar3; uVar19 = uVar19 + 1) {
      iVar13 = (int)uVar32;
      iVar21 = iVar31;
      if (iVar13 < iVar31) {
        iVar21 = iVar13;
      }
      uVar8 = uVar19;
      if (iVar31 < iVar13) {
        uVar8 = uVar32;
      }
      uVar30 = ((uint)(((int)uVar8 + 1) * (int)uVar8) >> 1) + iVar21;
      if (edges.store.m_data[uVar30] == -1) {
        pNVar14 = (this->m_nodes).m_data;
        fVar36 = (float)(**(code **)(*(long *)ifn + 0x10))(ifn);
        pbVar22 = &pNVar14[uVar19].m_x;
        fVar35 = (float)(**(code **)(*(long *)ifn + 0x10))(ifn,pbVar22);
        local_1ac = 0.0;
        if (fVar36 <= fVar35) {
          local_1b0 = 1.0;
          fVar39 = fVar36;
        }
        else {
          local_1b0 = 0.0;
          local_1ac = 1.0;
          fVar39 = fVar35;
          fVar35 = fVar36;
        }
        if ((accurary <= fVar35) && (fVar39 <= -accurary)) {
          iVar31 = 0x100;
          fVar36 = local_1b0;
          while (local_1b0 = fVar36, fVar40 = fVar35, bVar33 = iVar31 != 0, iVar31 = iVar31 + -1,
                bVar33) {
            t = (local_1b0 - local_1ac) * (fVar39 / (fVar39 - fVar40)) + local_1ac;
            x = Lerp<btVector3>(&pNVar14[uVar32].m_x,pbVar22,t);
            fVar35 = (float)(**(code **)(*(long *)ifn + 0x10))(ifn,&x);
            if ((t <= 0.0) || (1.0 <= t)) break;
            if (ABS(fVar35) < accurary) {
              if (0.0 < t) {
                x = Lerp<btVector3>(&pNVar14[uVar32].m_x,pbVar22,t);
                bVar41 = Lerp<btVector3>(&pNVar14[uVar32].m_v,&pNVar14[uVar19].m_v,t);
                fVar35 = pNVar14[uVar32].m_im;
                bVar37 = 0.0;
                fVar36 = pNVar14[uVar19].m_im;
                if (fVar35 <= 0.0) {
                  if (0.0 < fVar36) {
                    pNVar14[uVar19].m_im = fVar36 + fVar36;
                    bVar37 = 1.0 / (fVar36 + fVar36);
                  }
                }
                else if (fVar36 <= 0.0) {
                  pNVar14[uVar32].m_im = fVar35 + fVar35;
                  bVar37 = 1.0 / (fVar35 + fVar35);
                }
                else {
                  auVar38._4_4_ = fVar35;
                  auVar38._0_4_ = fVar36;
                  auVar38._8_8_ = 0;
                  auVar38 = divps(_DAT_001af400,auVar38);
                  fVar36 = auVar38._0_4_;
                  fVar39 = auVar38._4_4_;
                  fVar40 = (fVar36 - fVar39) * t + fVar39;
                  fVar35 = (fVar39 + fVar36) / (fVar39 + fVar36 + fVar40);
                  pNVar14[uVar32].m_im = 1.0 / (fVar39 * fVar35);
                  pNVar14[uVar19].m_im = 1.0 / (fVar36 * fVar35);
                  bVar37 = fVar35 * fVar40;
                }
                appendNode(this,&x,bVar37);
                iVar31 = (this->m_nodes).m_size;
                edges.store.m_data[uVar30] = iVar31 + -1;
                local_198 = bVar41.m_floats[0];
                bStack_194 = bVar41.m_floats[1];
                pbVar22 = &(this->m_nodes).m_data[(long)iVar31 + -1].m_v;
                pbVar22->m_floats[0] = local_198;
                pbVar22->m_floats[1] = bStack_194;
                pbVar22->m_floats[2] = bVar41.m_floats[2];
                pbVar22->m_floats[3] = bVar41.m_floats[3];
              }
              break;
            }
            fVar36 = t;
            if (fVar35 < 0.0) {
              fVar39 = fVar35;
              fVar35 = fVar40;
              fVar36 = local_1b0;
              local_1ac = t;
            }
          }
        }
      }
    }
    uVar20 = uVar20 + 1;
    uVar32 = uVar32 + 1;
  }
  pNVar14 = (this->m_nodes).m_data;
  uVar30 = (this->m_links).m_size;
  uVar20 = 0;
  uVar17 = (ulong)uVar30;
  if ((int)uVar30 < 1) {
    uVar17 = uVar20;
  }
  lVar15 = 0x18;
  for (; uVar17 != uVar20; uVar20 = uVar20 + 1) {
    pLVar29 = (this->m_links).m_data;
    iVar31 = (int)((*(long *)((long)pLVar29->m_n + lVar15 + -0x18) - (long)pNVar14) / 0x78);
    if ((iVar31 < (int)uVar3) &&
       (iVar21 = (int)((*(long *)((long)pLVar29->m_n + lVar15 + -0x10) - (long)pNVar14) / 0x78),
       iVar21 < (int)uVar3)) {
      iVar13 = iVar21;
      if (iVar31 < iVar21) {
        iVar13 = iVar31;
      }
      iVar23 = iVar21;
      if (iVar21 < iVar31) {
        iVar23 = iVar31;
      }
      lVar16 = (long)edges.store.m_data[((iVar23 + 1) * iVar23) / 2 + iVar13];
      if (0 < lVar16) {
        appendLink(this,(int)uVar20,(Material *)0x0);
        pLVar29 = (this->m_links).m_data;
        lVar18 = (long)(this->m_links).m_size;
        *(Node **)((long)pLVar29->m_n + lVar15 + -0x18) = (this->m_nodes).m_data + iVar31;
        *(Node **)((long)pLVar29->m_n + lVar15 + -0x10) = (this->m_nodes).m_data + lVar16;
        pLVar29[lVar18 + -1].m_n[0] = (this->m_nodes).m_data + lVar16;
        pLVar29[lVar18 + -1].m_n[1] = (this->m_nodes).m_data + iVar21;
      }
    }
    lVar15 = lVar15 + 0x48;
  }
  iVar31 = 0;
LAB_0019f6c0:
  bVar41.m_floats = x.m_floats;
  if (iVar31 < (this->m_faces).m_size) {
    pFVar6 = (this->m_faces).m_data;
    x.m_floats[1] = (btScalar)(((long)pFVar6[iVar31].m_n[1] - (long)pNVar14) / 0x78);
    x.m_floats[0] = (btScalar)(((long)pFVar6[iVar31].m_n[0] - (long)pNVar14) / 0x78);
    x.m_floats[3] = bVar41.m_floats[3];
    x.m_floats[2] = (btScalar)(((long)pFVar6[iVar31].m_n[2] - (long)pNVar14) / 0x78);
    uVar17 = 2;
    for (uVar20 = 0; uVar20 != 3; uVar20 = uVar20 + 1) {
      bVar37 = x.m_floats[uVar17 & 0xffffffff];
      if ((int)bVar37 < (int)uVar3) {
        bVar4 = x.m_floats[uVar20];
        if ((int)bVar4 < (int)uVar3) {
          bVar5 = bVar4;
          if ((int)bVar37 < (int)bVar4) {
            bVar5 = bVar37;
          }
          bVar7 = bVar4;
          if ((int)bVar4 < (int)bVar37) {
            bVar7 = bVar37;
          }
          iVar21 = edges.store.m_data[(((int)bVar7 + 1) * (int)bVar7) / 2 + (int)bVar5];
          lVar15 = (long)iVar21;
          if (0 < lVar15) {
            appendFace(this,iVar31,(Material *)0x0);
            lVar18 = (long)(this->m_faces).m_size;
            pFVar6 = (this->m_faces).m_data;
            lVar16 = 0;
            if (uVar20 != 2) {
              lVar16 = uVar20 + 1;
            }
            bVar5 = x.m_floats[lVar16];
            pFVar6[iVar31].m_n[0] = (this->m_nodes).m_data + (int)bVar5;
            pFVar6[iVar31].m_n[1] = (this->m_nodes).m_data + (int)bVar37;
            pFVar6[iVar31].m_n[2] = (this->m_nodes).m_data + lVar15;
            pFVar6[lVar18 + -1].m_n[0] = (this->m_nodes).m_data + lVar15;
            pFVar6[lVar18 + -1].m_n[1] = (this->m_nodes).m_data + (int)bVar4;
            pFVar6[lVar18 + -1].m_n[2] = (this->m_nodes).m_data + (int)bVar5;
            appendLink(this,iVar21,(int)bVar5,pFVar6[iVar31].super_Feature.m_material,false);
            goto LAB_0019f6c0;
          }
        }
      }
      uVar17 = uVar20;
    }
    iVar31 = iVar31 + 1;
    goto LAB_0019f6c0;
  }
  if (cut) {
    cnodes.m_ownsMemory = true;
    cnodes.m_data = (int *)0x0;
    cnodes.m_size = 0;
    cnodes.m_capacity = 0;
    uVar30 = (this->m_nodes).m_size;
    auVar11._12_4_ = 0;
    auVar11._0_4_ = x.m_floats[1];
    auVar11._4_4_ = x.m_floats[2];
    auVar11._8_4_ = x.m_floats[3];
    x.m_floats = (btScalar  [4])(auVar11 << 0x20);
    btAlignedObjectArray<int>::resize(&cnodes,uVar30,(int *)&x);
    uVar20 = 0;
    uVar17 = (ulong)uVar30;
    if ((int)uVar30 < 1) {
      uVar17 = uVar20;
    }
    for (uVar32 = 0; uVar17 != uVar32; uVar32 = uVar32 + 1) {
      pNVar14 = (this->m_nodes).m_data;
      x.m_floats = *(btScalar (*) [4])((long)(pNVar14->m_x).m_floats + uVar20);
      if ((long)uVar32 < (long)(int)uVar3) {
        fVar35 = (float)(**(code **)(*(long *)ifn + 0x10))(ifn,&x);
        if (ABS(fVar35) < accurary) {
          pNVar14 = (this->m_nodes).m_data;
          goto LAB_0019f8ee;
        }
      }
      else {
LAB_0019f8ee:
        puVar2 = (undefined8 *)((long)(pNVar14->m_v).m_floats + uVar20);
        uVar9 = *puVar2;
        uVar10 = puVar2[1];
        ranks._0_4_ = SUB84(uVar9,0);
        ranks.m_size = (int)((ulong)uVar9 >> 0x20);
        ranks.m_capacity = (int)uVar10;
        ranks._12_4_ = SUB84((ulong)uVar10 >> 0x20,0);
        fVar35 = *(float *)((long)(&pNVar14->m_n + 1) + uVar20);
        bVar37 = (btScalar)(-(uint)(0.0 < fVar35) & (uint)(1.0 / fVar35));
        if (0.0 < bVar37) {
          bVar37 = bVar37 * 0.5;
          *(float *)((long)(&pNVar14->m_n + 1) + uVar20) = fVar35 + fVar35;
        }
        appendNode(this,&x,bVar37);
        iVar31 = (this->m_nodes).m_size;
        cnodes.m_data[uVar32] = iVar31 + -1;
        pbVar22 = &(this->m_nodes).m_data[(long)iVar31 + -1].m_v;
        *(ulong *)pbVar22->m_floats = CONCAT44(ranks.m_size,ranks._0_4_);
        *(ulong *)(pbVar22->m_floats + 2) = CONCAT44(ranks._12_4_,ranks.m_capacity);
      }
      uVar20 = uVar20 + 0x78;
    }
    pNVar14 = (this->m_nodes).m_data;
    uVar3 = (this->m_links).m_size;
    uVar20 = 0;
    uVar17 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar17 = uVar20;
    }
    for (; uVar20 != uVar17; uVar20 = uVar20 + 1) {
      pLVar29 = (this->m_links).m_data;
      lVar15 = (long)pLVar29[uVar20].m_n[1] - (long)pNVar14;
      lVar16 = lVar15 % 0x78;
      iVar21 = (int)(((long)pLVar29[uVar20].m_n[0] - (long)pNVar14) / 0x78);
      iVar31 = (int)uVar20;
      if ((cnodes.m_data[iVar21] == 0) ||
         (lVar16 = (long)(int)(lVar15 / 0x78), cnodes.m_data[lVar16] == 0)) {
        fVar35 = (float)(**(code **)(*(long *)ifn + 0x10))
                                  (ifn,&(this->m_nodes).m_data[iVar21].m_x,lVar16);
        if ((fVar35 < accurary) &&
           (fVar35 = (float)(**(code **)(*(long *)ifn + 0x10))(), fVar35 < accurary))
        goto LAB_0019fa56;
      }
      else {
        appendLink(this,iVar31,(Material *)0x0);
        iVar31 = (this->m_links).m_size + -1;
LAB_0019fa56:
        if (iVar31 != 0) {
          pLVar29 = (this->m_links).m_data;
          for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
            if ((long)cnodes.m_data
                      [(int)(((long)pLVar29[iVar31].m_n[lVar15] - (long)pNVar14) / 0x78)] != 0) {
              pLVar29[iVar31].m_n[lVar15] =
                   (this->m_nodes).m_data +
                   cnodes.m_data[(int)(((long)pLVar29[iVar31].m_n[lVar15] - (long)pNVar14) / 0x78)];
            }
          }
        }
      }
    }
    uVar3 = (this->m_faces).m_size;
    uVar20 = 0;
    uVar17 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar17 = uVar20;
    }
    lVar15 = 0x10;
    for (; uVar20 != uVar17; uVar20 = uVar20 + 1) {
      pFVar6 = (this->m_faces).m_data;
      fVar35 = (float)(**(code **)(*(long *)ifn + 0x10))(ifn,&pFVar6[uVar20].m_n[0]->m_x);
      if (fVar35 < accurary) {
        fVar35 = (float)(**(code **)(*(long *)ifn + 0x10))(ifn,&pFVar6[uVar20].m_n[1]->m_x);
        if ((fVar35 < accurary) &&
           (fVar35 = (float)(**(code **)(*(long *)ifn + 0x10))(ifn,&pFVar6[uVar20].m_n[2]->m_x),
           fVar35 < accurary)) {
          for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
            if ((long)cnodes.m_data
                      [(int)((*(long *)((long)pFVar6->m_n + lVar16 * 8 + lVar15 + -0x10) -
                             (long)pNVar14) / 0x78)] != 0) {
              *(Node **)((long)pFVar6->m_n + lVar16 * 8 + lVar15 + -0x10) =
                   (this->m_nodes).m_data +
                   cnodes.m_data
                   [(int)((*(long *)((long)pFVar6->m_n + lVar16 * 8 + lVar15 + -0x10) -
                          (long)pNVar14) / 0x78)];
            }
          }
        }
      }
      lVar15 = lVar15 + 0x48;
    }
    ranks.m_ownsMemory = true;
    ranks.m_data = (int *)0x0;
    ranks.m_size = 0;
    ranks.m_capacity = 0;
    todelete.m_ownsMemory = true;
    todelete.m_data = (int *)0x0;
    todelete.m_size = 0;
    todelete.m_capacity = 0;
    auVar12._12_4_ = 0;
    auVar12._0_4_ = x.m_floats[1];
    auVar12._4_4_ = x.m_floats[2];
    auVar12._8_4_ = x.m_floats[3];
    x.m_floats = (btScalar  [4])(auVar12 << 0x20);
    btAlignedObjectArray<int>::resize(&ranks,(this->m_nodes).m_size,(int *)&x);
    uVar3 = (this->m_links).m_size;
    uVar20 = 0;
    uVar17 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar17 = uVar20;
    }
    ppNVar24 = ((this->m_links).m_data)->m_n;
    for (; uVar20 != uVar17; uVar20 = uVar20 + 1) {
      for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
        ranks.m_data[(int)(((long)ppNVar24[lVar15] - (long)pNVar14) / 0x78)] =
             ranks.m_data[(int)(((long)ppNVar24[lVar15] - (long)pNVar14) / 0x78)] + 1;
      }
      ppNVar24 = ppNVar24 + 9;
    }
    uVar3 = (this->m_faces).m_size;
    uVar20 = 0;
    uVar17 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar17 = uVar20;
    }
    ppNVar24 = ((this->m_faces).m_data)->m_n;
    for (; uVar20 != uVar17; uVar20 = uVar20 + 1) {
      for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
        ranks.m_data[(int)(((long)ppNVar24[lVar15] - (long)pNVar14) / 0x78)] =
             ranks.m_data[(int)(((long)ppNVar24[lVar15] - (long)pNVar14) / 0x78)] + 1;
      }
      ppNVar24 = ppNVar24 + 9;
    }
    iVar31 = (this->m_links).m_size;
    for (iVar21 = 0; iVar21 < iVar31; iVar21 = iVar21 + 1) {
      pLVar29 = (this->m_links).m_data;
      iVar23 = (int)(((long)pLVar29[iVar21].m_n[0] - (long)pNVar14) / 0x78);
      iVar13 = (int)(((long)pLVar29[iVar21].m_n[1] - (long)pNVar14) / 0x78);
      if ((ranks.m_data[iVar23] == 1) || (ranks.m_data[iVar13] == 1)) {
        ranks.m_data[iVar23] = ranks.m_data[iVar23] + -1;
        ranks.m_data[iVar13] = ranks.m_data[iVar13] + -1;
        pLVar28 = pLVar29 + iVar21;
        pLVar29 = pLVar29 + (long)(this->m_links).m_size + -1;
        lVar15 = 9;
        pLVar25 = pLVar28;
        pbVar27 = x.m_floats;
        for (; lVar16 = 0x44, pLVar26 = pLVar29, lVar15 != 0; lVar15 = lVar15 + -1) {
          *(void **)pbVar27 = (pLVar25->super_Feature).super_Element.m_tag;
          pLVar25 = (Link *)((long)pLVar25 + (ulong)bVar34 * -0x10 + 8);
          pbVar27 = pbVar27 + (ulong)bVar34 * 0xfffffffffffffffc + 2;
        }
        for (; lVar15 = 0x44, pbVar27 = x.m_floats, lVar16 != 0; lVar16 = lVar16 + -1) {
          *(undefined1 *)&(pLVar28->super_Feature).super_Element.m_tag =
               *(undefined1 *)&(pLVar26->super_Feature).super_Element.m_tag;
          pLVar26 = (Link *)((long)pLVar26 + (ulong)bVar34 * -2 + 1);
          pLVar28 = (Link *)((long)pLVar28 + (ulong)bVar34 * -2 + 1);
        }
        for (; lVar15 != 0; lVar15 = lVar15 + -1) {
          *(undefined1 *)&(pLVar29->super_Feature).super_Element.m_tag = *(undefined1 *)pbVar27;
          pbVar27 = (btScalar *)((long)pbVar27 + (ulong)bVar34 * -2 + 1);
          pLVar29 = (Link *)((long)pLVar29 + (ulong)bVar34 * -2 + 1);
        }
        iVar31 = (this->m_links).m_size + -1;
        (this->m_links).m_size = iVar31;
        iVar21 = iVar21 + -1;
      }
    }
    btAlignedObjectArray<int>::~btAlignedObjectArray(&todelete);
    btAlignedObjectArray<int>::~btAlignedObjectArray(&ranks);
    btAlignedObjectArray<int>::~btAlignedObjectArray(&cnodes);
  }
  this->m_bUpdateRtCst = true;
  btAlignedObjectArray<int>::~btAlignedObjectArray(&edges.store);
  return;
}

Assistant:

void			btSoftBody::refine(ImplicitFn* ifn,btScalar accurary,bool cut)
{
	const Node*			nbase = &m_nodes[0];
	int					ncount = m_nodes.size();
	btSymMatrix<int>	edges(ncount,-2);
	int					newnodes=0;
	int i,j,k,ni;

	/* Filter out		*/ 
	for(i=0;i<m_links.size();++i)
	{
		Link&	l=m_links[i];
		if(l.m_bbending)
		{
			if(!SameSign(ifn->Eval(l.m_n[0]->m_x),ifn->Eval(l.m_n[1]->m_x)))
			{
				btSwap(m_links[i],m_links[m_links.size()-1]);
				m_links.pop_back();--i;
			}
		}	
	}
	/* Fill edges		*/ 
	for(i=0;i<m_links.size();++i)
	{
		Link&	l=m_links[i];
		edges(int(l.m_n[0]-nbase),int(l.m_n[1]-nbase))=-1;
	}
	for(i=0;i<m_faces.size();++i)
	{	
		Face&	f=m_faces[i];
		edges(int(f.m_n[0]-nbase),int(f.m_n[1]-nbase))=-1;
		edges(int(f.m_n[1]-nbase),int(f.m_n[2]-nbase))=-1;
		edges(int(f.m_n[2]-nbase),int(f.m_n[0]-nbase))=-1;
	}
	/* Intersect		*/ 
	for(i=0;i<ncount;++i)
	{
		for(j=i+1;j<ncount;++j)
		{
			if(edges(i,j)==-1)
			{
				Node&			a=m_nodes[i];
				Node&			b=m_nodes[j];
				const btScalar	t=ImplicitSolve(ifn,a.m_x,b.m_x,accurary);
				if(t>0)
				{
					const btVector3	x=Lerp(a.m_x,b.m_x,t);
					const btVector3	v=Lerp(a.m_v,b.m_v,t);
					btScalar		m=0;
					if(a.m_im>0)
					{
						if(b.m_im>0)
						{
							const btScalar	ma=1/a.m_im;
							const btScalar	mb=1/b.m_im;
							const btScalar	mc=Lerp(ma,mb,t);
							const btScalar	f=(ma+mb)/(ma+mb+mc);
							a.m_im=1/(ma*f);
							b.m_im=1/(mb*f);
							m=mc*f;
						}
						else
						{ a.m_im/=0.5f;m=1/a.m_im; }
					}
					else
					{
						if(b.m_im>0)
						{ b.m_im/=0.5f;m=1/b.m_im; }
						else
							m=0;
					}
					appendNode(x,m);
					edges(i,j)=m_nodes.size()-1;
					m_nodes[edges(i,j)].m_v=v;
					++newnodes;
				}
			}
		}
	}
	nbase=&m_nodes[0];
	/* Refine links		*/ 
	for(i=0,ni=m_links.size();i<ni;++i)
	{
		Link&		feat=m_links[i];
		const int	idx[]={	int(feat.m_n[0]-nbase),
			int(feat.m_n[1]-nbase)};
		if((idx[0]<ncount)&&(idx[1]<ncount))
		{
			const int ni=edges(idx[0],idx[1]);
			if(ni>0)
			{
				appendLink(i);
				Link*		pft[]={	&m_links[i],
					&m_links[m_links.size()-1]};			
				pft[0]->m_n[0]=&m_nodes[idx[0]];
				pft[0]->m_n[1]=&m_nodes[ni];
				pft[1]->m_n[0]=&m_nodes[ni];
				pft[1]->m_n[1]=&m_nodes[idx[1]];
			}
		}
	}
	/* Refine faces		*/ 
	for(i=0;i<m_faces.size();++i)
	{
		const Face&	feat=m_faces[i];
		const int	idx[]={	int(feat.m_n[0]-nbase),
			int(feat.m_n[1]-nbase),
			int(feat.m_n[2]-nbase)};
		for(j=2,k=0;k<3;j=k++)
		{
			if((idx[j]<ncount)&&(idx[k]<ncount))
			{
				const int ni=edges(idx[j],idx[k]);
				if(ni>0)
				{
					appendFace(i);
					const int	l=(k+1)%3;
					Face*		pft[]={	&m_faces[i],
						&m_faces[m_faces.size()-1]};
					pft[0]->m_n[0]=&m_nodes[idx[l]];
					pft[0]->m_n[1]=&m_nodes[idx[j]];
					pft[0]->m_n[2]=&m_nodes[ni];
					pft[1]->m_n[0]=&m_nodes[ni];
					pft[1]->m_n[1]=&m_nodes[idx[k]];
					pft[1]->m_n[2]=&m_nodes[idx[l]];
					appendLink(ni,idx[l],pft[0]->m_material);
					--i;break;
				}
			}
		}
	}
	/* Cut				*/ 
	if(cut)
	{	
		btAlignedObjectArray<int>	cnodes;
		const int					pcount=ncount;
		int							i;
		ncount=m_nodes.size();
		cnodes.resize(ncount,0);
		/* Nodes		*/ 
		for(i=0;i<ncount;++i)
		{
			const btVector3	x=m_nodes[i].m_x;
			if((i>=pcount)||(btFabs(ifn->Eval(x))<accurary))
			{
				const btVector3	v=m_nodes[i].m_v;
				btScalar		m=getMass(i);
				if(m>0) { m*=0.5f;m_nodes[i].m_im/=0.5f; }
				appendNode(x,m);
				cnodes[i]=m_nodes.size()-1;
				m_nodes[cnodes[i]].m_v=v;
			}
		}
		nbase=&m_nodes[0];
		/* Links		*/ 
		for(i=0,ni=m_links.size();i<ni;++i)
		{
			const int		id[]={	int(m_links[i].m_n[0]-nbase),
				int(m_links[i].m_n[1]-nbase)};
			int				todetach=0;
			if(cnodes[id[0]]&&cnodes[id[1]])
			{
				appendLink(i);
				todetach=m_links.size()-1;
			}
			else
			{
				if((	(ifn->Eval(m_nodes[id[0]].m_x)<accurary)&&
					(ifn->Eval(m_nodes[id[1]].m_x)<accurary)))
					todetach=i;
			}
			if(todetach)
			{
				Link&	l=m_links[todetach];
				for(int j=0;j<2;++j)
				{
					int cn=cnodes[int(l.m_n[j]-nbase)];
					if(cn) l.m_n[j]=&m_nodes[cn];
				}			
			}
		}
		/* Faces		*/ 
		for(i=0,ni=m_faces.size();i<ni;++i)
		{
			Node**			n=	m_faces[i].m_n;
			if(	(ifn->Eval(n[0]->m_x)<accurary)&&
				(ifn->Eval(n[1]->m_x)<accurary)&&
				(ifn->Eval(n[2]->m_x)<accurary))
			{
				for(int j=0;j<3;++j)
				{
					int cn=cnodes[int(n[j]-nbase)];
					if(cn) n[j]=&m_nodes[cn];
				}
			}
		}
		/* Clean orphans	*/ 
		int							nnodes=m_nodes.size();
		btAlignedObjectArray<int>	ranks;
		btAlignedObjectArray<int>	todelete;
		ranks.resize(nnodes,0);
		for(i=0,ni=m_links.size();i<ni;++i)
		{
			for(int j=0;j<2;++j) ranks[int(m_links[i].m_n[j]-nbase)]++;
		}
		for(i=0,ni=m_faces.size();i<ni;++i)
		{
			for(int j=0;j<3;++j) ranks[int(m_faces[i].m_n[j]-nbase)]++;
		}
		for(i=0;i<m_links.size();++i)
		{
			const int	id[]={	int(m_links[i].m_n[0]-nbase),
				int(m_links[i].m_n[1]-nbase)};
			const bool	sg[]={	ranks[id[0]]==1,
				ranks[id[1]]==1};
			if(sg[0]||sg[1])
			{
				--ranks[id[0]];
				--ranks[id[1]];
				btSwap(m_links[i],m_links[m_links.size()-1]);
				m_links.pop_back();--i;
			}
		}
#if 0	
		for(i=nnodes-1;i>=0;--i)
		{
			if(!ranks[i]) todelete.push_back(i);
		}	
		if(todelete.size())
		{		
			btAlignedObjectArray<int>&	map=ranks;
			for(int i=0;i<nnodes;++i) map[i]=i;
			PointersToIndices(this);
			for(int i=0,ni=todelete.size();i<ni;++i)
			{
				int		j=todelete[i];
				int&	a=map[j];
				int&	b=map[--nnodes];
				m_ndbvt.remove(m_nodes[a].m_leaf);m_nodes[a].m_leaf=0;
				btSwap(m_nodes[a],m_nodes[b]);
				j=a;a=b;b=j;			
			}
			IndicesToPointers(this,&map[0]);
			m_nodes.resize(nnodes);
		}
#endif
	}
	m_bUpdateRtCst=true;
}